

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndiciRandom.cpp
# Opt level: O2

void __thiscall
IndiciRandom::generaIndici
          (IndiciRandom *this,unsigned_short *risultato,unsigned_short nIndiciGenerati)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  short sVar6;
  
  if (nIndiciGenerati <= this->dimensione) {
    sVar6 = -1;
    for (uVar5 = 0; nIndiciGenerati != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = sVar6 + this->dimensione;
      uVar4 = Random::randIntU(this->random,0,(uint)uVar3);
      puVar2 = this->vettoreIndici;
      uVar1 = puVar2[uVar4 & 0xffff];
      puVar2[uVar4 & 0xffff] = puVar2[uVar3];
      puVar2[uVar3] = uVar1;
      risultato[uVar5] = uVar1;
      sVar6 = sVar6 + -1;
    }
  }
  return;
}

Assistant:

void IndiciRandom::generaIndici(unsigned short risultato[], unsigned short nIndiciGenerati) {
	if (nIndiciGenerati > dimensione) return;

	unsigned short ran, tmp, dim;

	for (int k = 0; k < nIndiciGenerati; k++) {
		dim = dimensione - 1 - k;
		ran = random->randIntU(0, dim);
		tmp = vettoreIndici[ran];
		vettoreIndici[ran] = vettoreIndici[dim];
		vettoreIndici[dim] = tmp;

		risultato[k] = vettoreIndici[dim];
	}
}